

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O2

void __thiscall PluginFverb::PluginFverb(PluginFverb *this)

{
  double dVar1;
  Fverb *this_00;
  uint uVar2;
  Parameter local_e0;
  
  DISTRHO::Plugin::Plugin(&this->super_Plugin,0xf,0,0);
  (this->super_Plugin)._vptr_Plugin = (_func_int **)&PTR__PluginFverb_0010ece8;
  this_00 = (Fverb *)operator_new(8);
  Fverb::Fverb(this_00);
  (this->fDsp)._M_t.super___uniq_ptr_impl<Fverb,_std::default_delete<Fverb>_>._M_t.
  super__Tuple_impl<0UL,_Fverb_*,_std::default_delete<Fverb>_>.super__Head_base<0UL,_Fverb_*,_false>
  ._M_head_impl = this_00;
  this->fBypass = 0.0;
  *(undefined4 *)((long)&this->fBypass + 3) = 0;
  (this->fDry).step = 0.0;
  (this->fDry).target = 0.0;
  (this->fDry).mem = 0.0;
  (this->fDry).tau = 0.0;
  *(undefined8 *)&(this->fDry).sampleRate = 0;
  (this->fWet).target = 0.0;
  (this->fWet).mem = 0.0;
  (this->fWet).tau = 0.0;
  (this->fWet).sampleRate = 0.0;
  WDL_Resampler::WDL_Resampler(&this->fDownsampler);
  WDL_Resampler::WDL_Resampler(&this->fUpsampler);
  memset(&this->fLastDspOutputs,0,200);
  for (uVar2 = 0; uVar2 != 0xf; uVar2 = uVar2 + 1) {
    local_e0.hints = 0;
    local_e0.name.fBuffer = &DISTRHO::String::_null()::sNull;
    local_e0.name.fBufferLen = 0;
    local_e0.name.fBufferAlloc = false;
    local_e0.shortName.fBuffer = &DISTRHO::String::_null()::sNull;
    local_e0.shortName.fBufferLen = 0;
    local_e0.shortName.fBufferAlloc = false;
    local_e0.symbol.fBuffer = &DISTRHO::String::_null()::sNull;
    local_e0.symbol.fBufferLen = 0;
    local_e0.symbol.fBufferAlloc = false;
    local_e0.unit.fBuffer = &DISTRHO::String::_null()::sNull;
    local_e0.unit.fBufferLen = 0;
    local_e0.unit.fBufferAlloc = false;
    local_e0.description.fBuffer = &DISTRHO::String::_null()::sNull;
    local_e0.description.fBufferLen = 0;
    local_e0.description.fBufferAlloc = false;
    local_e0.ranges.def = 0.0;
    local_e0.ranges.min = 0.0;
    local_e0.ranges.max = 1.0;
    local_e0.enumValues.count = '\0';
    local_e0.enumValues.restrictedMode = false;
    local_e0.enumValues.values = (ParameterEnumerationValue *)0x0;
    local_e0.designation = kParameterDesignationNull;
    local_e0.midiCC = '\0';
    local_e0.groupId = 0xffffffff;
    (*(this->super_Plugin)._vptr_Plugin[0xb])(this,(ulong)uVar2,&local_e0);
    (*(this->super_Plugin)._vptr_Plugin[0xe])(local_e0.ranges.def,this,(ulong)uVar2);
    DISTRHO::Parameter::~Parameter(&local_e0);
  }
  LinearSmoother::setTimeConstant(&this->fDry,0.005);
  LinearSmoother::setTimeConstant(&this->fWet,0.005);
  dVar1 = DISTRHO::Plugin::getSampleRate(&this->super_Plugin);
  (*(this->super_Plugin)._vptr_Plugin[0x13])(SUB84(dVar1,0),this);
  return;
}

Assistant:

PluginFverb::PluginFverb()
    : Plugin(kNumParameters, 0, 0),
      fDsp(new Fverb)
{
    for (unsigned p = 0; p < kNumParameters; ++p) {
        Parameter param;
        initParameter(p, param);
        setParameterValue(p, param.ranges.def);
    }

    float tau = 5e-3;
    fDry.setTimeConstant(tau);
    fWet.setTimeConstant(tau);

    sampleRateChanged(getSampleRate());
}